

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O3

bool __thiscall
QDockWidgetPrivate::mouseDoubleClickEvent(QDockWidgetPrivate *this,QMouseEvent *event)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  QDockWidgetLayout *this_00;
  long in_FS_OFFSET;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined8 local_40;
  QPoint local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QDockWidgetLayout *)QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
  bVar3 = QDockWidgetLayout::nativeWindowDeco(this_00);
  if (!bVar3) {
    local_38.xp.m_i = (this_00->_titleArea).x1.m_i;
    local_38.yp.m_i = (this_00->_titleArea).y1.m_i;
    uStack_30._0_4_ = (this_00->_titleArea).x2;
    uStack_30._4_4_ = (this_00->_titleArea).y2;
    if (*(int *)(event + 0x40) == 1) {
      auVar7 = QEventPoint::position();
      dVar6 = (double)((ulong)auVar7._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._0_8_
      ;
      bVar3 = 2147483647.0 < dVar6;
      if (dVar6 <= -2147483648.0) {
        dVar6 = -2147483648.0;
      }
      dVar5 = (double)((ulong)auVar7._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._8_8_
      ;
      bVar2 = 2147483647.0 < dVar5;
      if (dVar5 <= -2147483648.0) {
        dVar5 = -2147483648.0;
      }
      local_40 = CONCAT44((int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 |
                                       ~-(ulong)bVar2 & (ulong)dVar5),
                          (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 |
                                       ~-(ulong)bVar3 & (ulong)dVar6));
      cVar4 = QRect::contains(&local_38,SUB81(&local_40,0));
      if ((cVar4 != '\0') &&
         (((this->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
           super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 4) != 0)) {
        lVar1 = *(long *)&(this->super_QWidgetPrivate).field_0x8;
        setFloating(*(QDockWidgetPrivate **)(lVar1 + 8),
                    (*(byte *)(*(long *)(lVar1 + 0x20) + 0xc) & 1) == 0);
        bVar3 = true;
        goto LAB_00400245;
      }
    }
  }
  bVar3 = false;
LAB_00400245:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockWidgetPrivate::mouseDoubleClickEvent(QMouseEvent *event)
{
    QDockWidgetLayout *dwLayout = qobject_cast<QDockWidgetLayout*>(layout);

    if (!dwLayout->nativeWindowDeco()) {
        QRect titleArea = dwLayout->titleArea();

        if (event->button() == Qt::LeftButton && titleArea.contains(event->position().toPoint()) &&
            hasFeature(this, QDockWidget::DockWidgetFloatable)) {
            toggleTopLevel();
            return true;
        }
    }
    return false;
}